

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.cpp
# Opt level: O2

Entry * cali::Entry::unpack(Entry *__return_storage_ptr__,CaliperMetadataAccessInterface *db,
                           uchar *buffer,size_t *inc)

{
  anon_union_8_7_33918203_for_value aVar1;
  int iVar2;
  uint64_t uVar3;
  undefined4 extraout_var;
  cali_variant_t cVar5;
  size_t p;
  size_t local_28;
  Node *pNVar4;
  
  local_28 = 0;
  uVar3 = vldec_u64(buffer,&local_28);
  iVar2 = (**db->_vptr_CaliperMetadataAccessInterface)(db,uVar3);
  pNVar4 = (Node *)CONCAT44(extraout_var,iVar2);
  __return_storage_ptr__->m_node = pNVar4;
  aVar1 = (pNVar4->m_data).m_v.value;
  (__return_storage_ptr__->m_value).m_v.type_and_size = (pNVar4->m_data).m_v.type_and_size;
  (__return_storage_ptr__->m_value).m_v.value = aVar1;
  if (pNVar4->m_attribute == 8) {
    cVar5 = cali_variant_unpack(buffer + local_28,&local_28,(_Bool *)0x0);
    (__return_storage_ptr__->m_value).m_v = cVar5;
  }
  if (inc != (size_t *)0x0) {
    *inc = *inc + local_28;
  }
  return __return_storage_ptr__;
}

Assistant:

Entry Entry::unpack(const CaliperMetadataAccessInterface& db, const unsigned char* buffer, size_t* inc)
{
    size_t p = 0;
    Entry  ret { db.node(vldec_u64(buffer, &p)) };

    if (ret.m_node->attribute() == Attribute::NAME_ATTR_ID)
        ret.m_value = Variant::unpack(buffer + p, &p);

    if (inc)
        *inc += p;

    return ret;
}